

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imleInline.hpp
# Opt level: O1

bool __thiscall
IMLE<1,_1,_FastLinearExpert>::load(IMLE<1,_1,_FastLinearExpert> *this,string *filename)

{
  pointer pFVar1;
  char cVar2;
  basic_iserializer *pbVar3;
  void *x;
  text_iarchive archive;
  ifstream fs;
  text_iarchive local_2a0;
  istream local_220 [520];
  
  std::ifstream::ifstream(local_220,(filename->_M_dataplus)._M_p,_S_in);
  cVar2 = std::__basic_file<char>::is_open();
  if (cVar2 == '\0') {
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_2a0,
                   "IMLE: Could not open file ",filename);
    message(this,(string *)&local_2a0);
    if ((undefined1 *)local_2a0._0_8_ != &local_2a0.field_0x10) {
      operator_delete((void *)local_2a0._0_8_);
    }
  }
  else {
    boost::archive::text_iarchive::text_iarchive(&local_2a0,local_220,0);
    pFVar1 = (this->experts).
             super_vector<FastLinearExpert<1,_1>,_Eigen::aligned_allocator_indirection<FastLinearExpert<1,_1>_>_>
             .
             super__Vector_base<FastLinearExpert<1,_1>,_Eigen::aligned_allocator_indirection<FastLinearExpert<1,_1>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((this->experts).
        super_vector<FastLinearExpert<1,_1>,_Eigen::aligned_allocator_indirection<FastLinearExpert<1,_1>_>_>
        .
        super__Vector_base<FastLinearExpert<1,_1>,_Eigen::aligned_allocator_indirection<FastLinearExpert<1,_1>_>_>
        ._M_impl.super__Vector_impl_data._M_finish != pFVar1) {
      (this->experts).
      super_vector<FastLinearExpert<1,_1>,_Eigen::aligned_allocator_indirection<FastLinearExpert<1,_1>_>_>
      .
      super__Vector_base<FastLinearExpert<1,_1>,_Eigen::aligned_allocator_indirection<FastLinearExpert<1,_1>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = pFVar1;
    }
    set_internal_parameters(this);
    this->noise_to_go = 0;
    pbVar3 = &boost::serialization::
              singleton<boost::archive::detail::iserializer<boost::archive::text_iarchive,_IMLE<1,_1,_FastLinearExpert>_>_>
              ::get_instance()->super_basic_iserializer;
    boost::archive::detail::basic_iarchive::load_object((basic_iarchive *)&local_2a0,this,pbVar3);
    std::ifstream::close();
    boost::archive::text_iarchive_impl<boost::archive::text_iarchive>::~text_iarchive_impl
              (&local_2a0.super_text_iarchive_impl<boost::archive::text_iarchive>);
  }
  std::ifstream::~ifstream(local_220);
  return (bool)cVar2;
}

Assistant:

IMLE_CLASS_TEMPLATE
bool IMLE_base::load(std::string const &filename)
{
    std::ifstream fs(filename.c_str());
	if( !fs.is_open() )
	{
		message(OPENERR + filename);
		return false;
	}
    boost::archive::text_iarchive archive(fs);

    reset();
	archive & (*this);
    fs.close();

    return true;
}